

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * qv(QString *__return_storage_ptr__,ProString *val)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QStringBuilder<char,_QString> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QMakeEvaluator::quoteValue((QString *)&local_58,val);
  local_40.b.d.size = local_58.size;
  local_40.b.d.ptr = local_58.ptr;
  local_40.b.d.d = local_58.d;
  local_40.a = ' ';
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QStringBuilder<char,_QString>::convertTo<QString>(__return_storage_ptr__,&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString
qv(const ProString &val)
{
    return ' ' + QMakeEvaluator::quoteValue(val);
}